

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IOcontroller.h
# Opt level: O0

string * IOcontroller::get_out_file_name
                   (string *__return_storage_ptr__,string *graphName,string *algName,int seedsize,
                   string *probDist,float probEdge)

{
  bool bVar1;
  string local_208;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  string local_148;
  string local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_58;
  float local_34;
  string *psStack_30;
  float probEdge_local;
  string *probDist_local;
  string *psStack_20;
  int seedsize_local;
  string *algName_local;
  string *graphName_local;
  
  local_34 = probEdge;
  psStack_30 = probDist;
  probDist_local._4_4_ = seedsize;
  psStack_20 = algName;
  algName_local = graphName;
  graphName_local = __return_storage_ptr__;
  bVar1 = std::operator==(probDist,"UNI");
  if (bVar1) {
    std::operator+(&local_f8,graphName,"_");
    std::operator+(&local_d8,&local_f8,algName);
    std::operator+(&local_b8,&local_d8,"_k");
    std::__cxx11::to_string(&local_128,probDist_local._4_4_);
    std::operator+(&local_98,&local_b8,&local_128);
    std::operator+(&local_78,&local_98,"_");
    std::operator+(&local_58,&local_78,probDist);
    std::__cxx11::to_string(&local_148,local_34);
    std::operator+(__return_storage_ptr__,&local_58,&local_148);
    std::__cxx11::string::~string((string *)&local_148);
    std::__cxx11::string::~string((string *)&local_58);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_b8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
  }
  else {
    std::operator+(&local_1e8,graphName,"_");
    std::operator+(&local_1c8,&local_1e8,algName);
    std::operator+(&local_1a8,&local_1c8,"_k");
    std::__cxx11::to_string(&local_208,probDist_local._4_4_);
    std::operator+(&local_188,&local_1a8,&local_208);
    std::operator+(&local_168,&local_188,"_");
    std::operator+(__return_storage_ptr__,&local_168,probDist);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_208);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1c8);
    std::__cxx11::string::~string((string *)&local_1e8);
  }
  return __return_storage_ptr__;
}

Assistant:

static std::string get_out_file_name(const std::string graphName, const std::string algName, const int seedsize,
                                         const std::string probDist, const float probEdge)
    {
        if (probDist == "UNI")
        {
            return graphName + "_" + algName + "_k" + std::to_string(seedsize) + "_" + probDist + std::
            to_string(probEdge);
        }
        return graphName + "_" + algName + "_k" + std::to_string(seedsize) + "_" + probDist;
    }